

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O2

UA_StatusCode
setDataSource(UA_Server *server,UA_Session *session,UA_VariableNode *node,UA_DataSource *dataSource)

{
  _func_UA_StatusCode_void_ptr_UA_NodeId_UA_Boolean_UA_NumericRange_ptr_UA_DataValue_ptr *p_Var1;
  UA_StatusCode UVar2;
  
  UVar2 = 0x805f0000;
  if (node->nodeClass == UA_NODECLASS_VARIABLE) {
    if (node->valueSource == UA_VALUESOURCE_DATA) {
      UA_DataValue_deleteMembers(&(node->value).data.value);
    }
    (node->value).dataSource.write = dataSource->write;
    p_Var1 = dataSource->read;
    (node->value).dataSource.handle = dataSource->handle;
    (node->value).dataSource.read = p_Var1;
    node->valueSource = UA_VALUESOURCE_DATASOURCE;
    UVar2 = 0;
  }
  return UVar2;
}

Assistant:

static UA_StatusCode
setDataSource(UA_Server *server, UA_Session *session,
              UA_VariableNode* node, UA_DataSource *dataSource) {
    if(node->nodeClass != UA_NODECLASS_VARIABLE)
        return UA_STATUSCODE_BADNODECLASSINVALID;
    if(node->valueSource == UA_VALUESOURCE_DATA)
        UA_DataValue_deleteMembers(&node->value.data.value);
    node->value.dataSource = *dataSource;
    node->valueSource = UA_VALUESOURCE_DATASOURCE;
    return UA_STATUSCODE_GOOD;
}